

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O2

void __thiscall pg::QPTSolver::run(QPTSolver *this)

{
  ulong uVar1;
  unsigned_long uVar2;
  int iVar3;
  ostream *poVar4;
  int *piVar5;
  uint *puVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  int iVar11;
  Game *pGVar12;
  int max1;
  int max0;
  int local_64;
  int k1;
  int k0;
  unsigned_long goal1;
  unsigned_long goal0;
  long local_48;
  int local_3c;
  long local_38;
  
  updateState(this,&goal0,&goal1,&max0,&max1,&k0,&k1);
  poVar4 = std::operator<<((this->super_Solver).logger,"for odd with even measures: n0=");
  uVar2 = goal0;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", k=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,k0);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((this->super_Solver).logger,"for even with odd measures: n1=");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,", k=");
  iVar11 = k1;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,k1);
  std::endl<char,std::char_traits<char>>(poVar4);
  pGVar12 = (this->super_Solver).game;
  local_3c = iVar11;
  if (iVar11 < k0) {
    local_3c = k0;
  }
  uVar1 = pGVar12->n_vertices;
  piVar5 = (int *)operator_new__(-(ulong)((long)local_3c * uVar1 >> 0x3e != 0) |
                                 (long)local_3c * uVar1 * 4);
  this->pm_nodes = piVar5;
  piVar5 = (int *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 << 2);
  this->strategy = piVar5;
  (this->todo).pointer = 0;
  puVar6 = (this->todo).queue;
  if (puVar6 != (uint *)0x0) {
    operator_delete__(puVar6);
    pGVar12 = (this->super_Solver).game;
  }
  puVar6 = (uint *)operator_new__(uVar1 << 2 & 0x3fffffffc);
  (this->todo).queue = puVar6;
  bitset::resize(&this->dirty,pGVar12->n_vertices);
  this->lift_count = 0;
  this->lift_attempt = 0;
  if (this->bounded == true) {
    for (local_64 = 1; local_64 <= local_3c; local_64 = (local_64 - (uint)(lVar8 != lVar7)) + 1) {
      local_38 = this->lift_count;
      local_48 = this->lift_attempt;
      lVar7 = Game::count_unsolved((this->super_Solver).game);
      iVar9 = max0;
      iVar11 = max1;
      this->pl = 0;
      this->k = local_64;
      this->max = max0;
      iVar3 = max1;
      if (max1 == -1) {
        iVar3 = 0;
      }
      this->maxo = iVar3;
      this->goal = goal0;
      liftloop(this);
      lVar8 = Game::count_unsolved((this->super_Solver).game);
      poVar4 = std::operator<<((this->super_Solver).logger,"after even with k=");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->k);
      poVar4 = std::operator<<(poVar4,", ");
      *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 9;
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      poVar4 = std::operator<<(poVar4," lifts, ");
      *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 9;
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      poVar4 = std::operator<<(poVar4," lift attempts, ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," unsolved left.");
      std::endl<char,std::char_traits<char>>(poVar4);
      if (lVar8 == 0) break;
      local_48 = lVar7;
      if (lVar8 != lVar7) {
        updateState(this,&goal0,&goal1,&max0,&max1,&k0,&k1);
        iVar9 = max0;
        iVar11 = max1;
      }
      this->pl = 1;
      if (iVar9 == -1) {
        iVar9 = 1;
      }
      this->k = local_64;
      this->max = iVar11;
      this->maxo = iVar9;
      this->goal = goal1;
      liftloop(this);
      lVar8 = Game::count_unsolved((this->super_Solver).game);
      poVar4 = std::operator<<((this->super_Solver).logger,"after odd  with k=");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->k);
      poVar4 = std::operator<<(poVar4,", ");
      *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 9;
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      poVar4 = std::operator<<(poVar4," lifts, ");
      *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 9;
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      poVar4 = std::operator<<(poVar4," lift attempts, ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," unsolved left.");
      std::endl<char,std::char_traits<char>>(poVar4);
      lVar7 = local_48;
      if (lVar8 == 0) break;
      if (lVar8 != local_48) {
        updateState(this,&goal0,&goal1,&max0,&max1,&k0,&k1);
      }
    }
    poVar4 = std::operator<<((this->super_Solver).logger,"solved with ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," lifts, ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," lift attempts, max k ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_64);
    pcVar10 = ".";
  }
  else {
    this->pl = 0;
    this->k = k0;
    this->max = max0;
    iVar11 = 0;
    if (max1 != -1) {
      iVar11 = max1;
    }
    this->maxo = iVar11;
    this->goal = uVar2;
    liftloop(this);
    lVar7 = Game::count_unsolved((this->super_Solver).game);
    poVar4 = std::operator<<((this->super_Solver).logger,"after even, ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," lifts, ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," lift attempts, ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," unsolved left.");
    std::endl<char,std::char_traits<char>>(poVar4);
    if (lVar7 != 0) {
      updateState(this,&goal0,&goal1,&max0,&max1,&k0,&k1);
      this->pl = 1;
      this->k = k1;
      this->max = max1;
      if (max0 == -1) {
        max0 = 1;
      }
      this->maxo = max0;
      this->goal = goal1;
      liftloop(this);
    }
    poVar4 = std::operator<<((this->super_Solver).logger,"solved with ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," lifts, ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    pcVar10 = " lift attempts.";
  }
  poVar4 = std::operator<<(poVar4,pcVar10);
  std::endl<char,std::char_traits<char>>(poVar4);
  if (this->pm_nodes != (int *)0x0) {
    operator_delete__(this->pm_nodes);
  }
  if (this->strategy != (int *)0x0) {
    operator_delete__(this->strategy);
    return;
  }
  return;
}

Assistant:

void
QPTSolver::run()
{
    unsigned long goal0, goal1;
    int max0, max1;
    int k0, k1;

    updateState(goal0, goal1, max0, max1, k0, k1);
    
    logger << "for odd with even measures: n0=" << goal0 << ", k=" << k0 << std::endl;
    logger << "for even with odd measures: n1=" << goal1 << ", k=" << k1 << std::endl;

    // for allocation, just use biggest k
    int big_k = k0 > k1 ? k0 : k1;

    // now create the data structure, for each vertex a PM
    pm_nodes = new int[big_k * nodecount()];
    strategy = new int[nodecount()];

    // initialize todo/dirty queues
    todo.resize(nodecount());
    dirty.resize(nodecount());

    lift_count = 0;
    lift_attempt = 0;

    if (bounded) {
        int i;
        for (i=1; i<=big_k; i++) {
            long _l = lift_count, _a = lift_attempt;
            uint64_t _c = game.count_unsolved();
            uint64_t c = _c;

            /*if (i <= k0)*/ {
                pl = 0;
                k = i;
                max = max0;
                maxo = max1 != -1 ? max1 : 0; // used in bump
                goal = goal0;
                liftloop();

                c = game.count_unsolved();
                logger << "after even with k=" << k << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;
                if (c == 0) break;

                if (c != _c) updateState(goal0, goal1, max0, max1, k0, k1);
                _l = lift_count;
                _a = lift_attempt;
            }
            /*if (i <= k1)*/ {
                pl = 1;
                k = i;
                max = max1;
                maxo = max0 != -1 ? max0 : 1; // used in bump
                goal = goal1;
                liftloop();

                c = game.count_unsolved();
                logger << "after odd  with k=" << k << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;
                if (c == 0) break;

                if (c != _c) updateState(goal0, goal1, max0, max1, k0, k1);
            }
            if (c != _c) i--;
        } 

        logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts, max k " << i << "." << std::endl;
    } else if (ODDFIRST) {
        pl = 1;
        k = k1;
        max = max1;
        maxo = max0 != -1 ? max0 : 1; // used in bump
        goal = goal1;
        liftloop();

        uint64_t c = game.count_unsolved();
        logger << "after odd, " << lift_count << " lifts, " << lift_attempt << " lift attempts, " << c << " unsolved left." << std::endl;

        if (c != 0) {
            updateState(goal0, goal1, max0, max1, k0, k1);

            pl = 0;
            k = k0;
            max = max0;
            maxo = max1 != -1 ? max1 : 0; // used in bump
            goal = goal0;
            liftloop();
        }

        logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
    } else {
        pl = 0;
        k = k0;
        max = max0;
        maxo = max1 != -1 ? max1 : 0; // used in bump
        goal = goal0;
        liftloop();

        uint64_t c = game.count_unsolved();
        logger << "after even, " << lift_count << " lifts, " << lift_attempt << " lift attempts, " << c << " unsolved left." << std::endl;

        if (c != 0) {
            updateState(goal0, goal1, max0, max1, k0, k1);

            pl = 1;
            k = k1;
            max = max1;
            maxo = max0 != -1 ? max0 : 1; // used in bump
            goal = goal1;
            liftloop();
        }

        logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
    }

    delete[] pm_nodes;
    delete[] strategy;
}